

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_mac.c
# Opt level: O1

void mac_freectx(void *vgctx)

{
  EVP_MD_CTX_free(*(undefined8 *)((long)vgctx + 0x28));
  CRYPTO_free(vgctx);
  return;
}

Assistant:

static void mac_freectx(void *vgctx)
{
    GOST_CTX *gctx = vgctx;

    /*
     * We don't free gctx->digest here.
     * That will be done by the provider teardown, via
     * GOST_prov_deinit_digests() (defined at the bottom of this file).
     */
    EVP_MD_CTX_free(gctx->dctx);
    OPENSSL_free(gctx);
}